

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_queue_tail_multiple_seq_cst.h
# Opt level: O1

Allocation * __thiscall
density::detail::
LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
::try_inplace_allocate_impl<(density::detail::LfQueue_ProgressGuarantee)0>
          (Allocation *__return_storage_ptr__,
          LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
          *this,uintptr_t i_control_bits,bool i_include_type,size_t i_size,size_t i_alignment)

{
  __int_type _Var1;
  PinResult PVar2;
  LfQueueControl *pLVar3;
  LfQueueControl *pLVar4;
  ulong uVar5;
  char cVar6;
  size_t i_alignment_00;
  ulong uVar7;
  LfQueueControl *pLVar8;
  ulong *i_address;
  bool bVar9;
  PinGuard<density::basic_default_allocator<65536UL>,_(density::progress_guarantee)0> scoped_pin;
  PinGuard<density::basic_default_allocator<65536UL>,_(density::progress_guarantee)0> local_60;
  long local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  if (7 < i_control_bits) {
    density_tests::detail::assert_failed<>
              ("(i_control_bits & ~(LfQueue_Busy | LfQueue_Dead | LfQueue_External)) == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/detail/lf_queue_tail_multiple_seq_cst.h"
               ,0x80);
  }
  if (((i_alignment & i_alignment - 1) != 0) || (i_size % i_alignment != 0)) {
    density_tests::detail::assert_failed<>
              ("is_power_of_2(i_alignment) && (i_size % i_alignment) == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/detail/lf_queue_tail_multiple_seq_cst.h"
               ,0x81);
  }
  i_alignment_00 = 8;
  if (8 < i_alignment) {
    i_alignment_00 = i_alignment;
  }
  uVar5 = i_size + 7 & 0xfffffffffffffff8;
  if (7 < i_alignment) {
    uVar5 = i_size;
  }
  uVar7 = uVar5 + i_alignment_00 + (ulong)i_include_type * 8 + 0x3f;
  local_60.m_pinned_page = (void *)0x0;
  local_60.m_allocator = (basic_default_allocator<65536UL> *)this;
  if (uVar7 < 0x1000) {
    local_38 = uVar7 >> 6;
    uVar5 = i_alignment_00 - (i_alignment_00 >> 1 & 0x5555555555555555);
    uVar5 = (uVar5 >> 2 & 0x3333333333333333) + (uVar5 & 0x3333333333333333);
    local_40 = ((uVar5 >> 4) + uVar5 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38;
    local_50 = (ulong)i_include_type * 8 + i_alignment_00 + 7;
    local_48 = -i_alignment_00;
    pLVar8 = (LfQueueControl *)(this->m_tail).super___atomic_base<unsigned_long>._M_i;
    do {
      pLVar4 = pLVar8;
      if (((ulong)pLVar8 & 0x3f) == 0) {
        _Var1 = (long)&pLVar8->m_next + (ulong)((uint)uVar7 & 0xfc0);
        if (_Var1 - ((ulong)pLVar8 & 0xffffffffffff0000) < 0xffc1) {
          cVar6 = '\0';
          LOCK();
          pLVar4 = (LfQueueControl *)(this->m_tail).super___atomic_base<unsigned_long>._M_i;
          bVar9 = pLVar8 == pLVar4;
          if (bVar9) {
            (this->m_tail).super___atomic_base<unsigned_long>._M_i = (ulong)pLVar8 | local_38;
            pLVar4 = pLVar8;
          }
          UNLOCK();
          if (bVar9) {
            LOCK();
            pLVar8->m_next = _Var1 + i_control_bits;
            UNLOCK();
            LOCK();
            if (((ulong)pLVar8 | local_38) == (this->m_tail).super___atomic_base<unsigned_long>._M_i
               ) {
              (this->m_tail).super___atomic_base<unsigned_long>._M_i = _Var1;
            }
            UNLOCK();
            if (1 < (uint)local_40) {
              density_tests::detail::assert_failed<>
                        ("is_power_of_2(i_alignment)",
                         "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/density_common.h"
                         ,0x10a);
            }
            __return_storage_ptr__->m_control_block = pLVar8;
            __return_storage_ptr__->m_next_ptr = _Var1 + i_control_bits;
            __return_storage_ptr__->m_user_storage =
                 (void *)((long)&pLVar8->m_next + local_50 & local_48);
            cVar6 = '\x01';
          }
        }
        else {
          cVar6 = '\0';
          pLVar4 = (LfQueueControl *)page_overflow(this,LfQueue_Throwing,(uintptr_t)pLVar8);
        }
      }
      else {
        i_address = (ulong *)((ulong)pLVar8 & 0xffffffffffffffc0);
        PVar2 = PinGuard<density::basic_default_allocator<65536UL>,_(density::progress_guarantee)0>
                ::pin(&local_60,i_address);
        if (PVar2 == AlreadyPinned) {
LAB_00aba115:
          pLVar8 = (LfQueueControl *)
                   ((ulong)(uint)((int)((ulong)pLVar8 & 0x3f) << 6) + (long)i_address);
          LOCK();
          if (*i_address == 0) {
            *i_address = (ulong)pLVar8 | 1;
          }
          UNLOCK();
          cVar6 = '\0';
          LOCK();
          pLVar3 = (LfQueueControl *)(this->m_tail).super___atomic_base<unsigned_long>._M_i;
          bVar9 = pLVar4 == pLVar3;
          if (bVar9) {
            (this->m_tail).super___atomic_base<unsigned_long>._M_i = (__int_type)pLVar8;
            pLVar3 = pLVar4;
          }
          UNLOCK();
          pLVar4 = pLVar3;
          if (bVar9) {
            pLVar4 = pLVar8;
          }
        }
        else if (PVar2 == PinFailed) {
          __return_storage_ptr__->m_user_storage = (void *)0x0;
          cVar6 = '\x01';
        }
        else {
          pLVar4 = (LfQueueControl *)(this->m_tail).super___atomic_base<unsigned_long>._M_i;
          if (pLVar4 == pLVar8) goto LAB_00aba115;
          cVar6 = (pLVar4 != pLVar8) * '\x03';
        }
      }
      pLVar8 = pLVar4;
    } while ((cVar6 == '\0') || (cVar6 == '\x03'));
  }
  else {
    LFQueue_Base<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>,_density::basic_default_allocator<65536UL>,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>
    ::external_allocate<(density::detail::LfQueue_ProgressGuarantee)0>
              (__return_storage_ptr__,
               (LFQueue_Base<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>,_density::basic_default_allocator<65536UL>,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>
                *)this,i_control_bits,uVar5,i_alignment_00);
  }
  if (local_60.m_pinned_page != (void *)0x0) {
    PageAllocator<density::detail::SystemPageManager<65536UL>_>::unpin_page(local_60.m_pinned_page);
  }
  return __return_storage_ptr__;
}

Assistant:

Allocation try_inplace_allocate_impl(
              uintptr_t i_control_bits,
              bool      i_include_type,
              size_t    i_size,
              size_t    i_alignment) noexcept(PROGRESS_GUARANTEE != LfQueue_Throwing)
            {
                auto guarantee =
                  PROGRESS_GUARANTEE; // used to avoid warnings about constant conditional expressions

                DENSITY_ASSERT_INTERNAL(
                  (i_control_bits & ~(LfQueue_Busy | LfQueue_Dead | LfQueue_External)) == 0);
                DENSITY_ASSERT_INTERNAL(is_power_of_2(i_alignment) && (i_size % i_alignment) == 0);

                if (i_alignment < min_alignment)
                {
                    i_alignment = min_alignment;
                    i_size      = uint_upper_align(i_size, min_alignment);
                }

                auto const overhead = i_include_type ? s_element_min_offset : s_rawblock_min_offset;
                auto const required_size = overhead + i_size + (i_alignment - min_alignment);
                auto const required_units =
                  (required_size + (s_alloc_granularity - 1)) / s_alloc_granularity;

                // instantiate a pin-guard - we will use it only in case of contention
                PinGuard<ALLOCATOR_TYPE, ToDenGuarantee(PROGRESS_GUARANTEE)> scoped_pin(this);

                bool const fits_in_page =
                  required_units <
                  size_min(s_alloc_granularity, s_end_control_offset / s_alloc_granularity);
                if (fits_in_page)
                {
                    auto tail = m_tail.load(mem_relaxed);
                    for (;;)
                    {
                        static_assert(is_power_of_2(s_alloc_granularity), "");
                        auto const rest = tail & (s_alloc_granularity - 1);
                        if (rest == 0)
                        {
                            // we can try the allocation
                            auto const new_control = reinterpret_cast<ControlBlock *>(tail);
                            auto const future_tail = tail + required_units * s_alloc_granularity;
                            auto const page_start =
                              uint_lower_align(tail, ALLOCATOR_TYPE::page_alignment);
                            auto const future_tail_offset = future_tail - page_start;
                            auto       transient_tail     = tail + required_units;
                            if (DENSITY_LIKELY(future_tail_offset <= s_end_control_offset))
                            {
                                DENSITY_ASSUME(required_units < s_alloc_granularity);
                                if (m_tail.compare_exchange_weak(tail, transient_tail, mem_relaxed))
                                {
                                    raw_atomic_store(
                                      &new_control->m_next,
                                      future_tail + i_control_bits,
                                      mem_relaxed);

                                    m_tail.compare_exchange_strong(
                                      transient_tail, future_tail, mem_relaxed);

                                    auto const user_storage = address_upper_align(
                                      address_add(new_control, overhead), i_alignment);
                                    DENSITY_ASSUME(
                                      reinterpret_cast<uintptr_t>(user_storage) + i_size <=
                                      future_tail);
                                    return Allocation{
                                      new_control, future_tail + i_control_bits, user_storage};
                                }
                                else
                                {
                                    if (guarantee == LfQueue_WaitFree)
                                    {
                                        return Allocation{};
                                    }
                                }
                            }
                            else
                            {
                                tail = page_overflow(guarantee, tail);

                                if (guarantee != LfQueue_Throwing)
                                {
                                    if (tail == 0)
                                    {
                                        return Allocation{};
                                    }
                                }
                                else
                                {
                                    DENSITY_ASSUME(tail != 0);
                                }
                            }
                        }
                        else
                        {
                            // the memory protection currently used (pinning) is based on an atomic increment, that is not wait-free
                            if (guarantee == LfQueue_WaitFree)
                            {
                                return Allocation{};
                            }

                            // an allocation is in progress, we help it
                            auto const clean_tail = tail - rest;
                            auto const incomplete_control =
                              reinterpret_cast<ControlBlock *>(clean_tail);
                            auto const next = clean_tail + rest * s_alloc_granularity;

                            auto const pin_result = scoped_pin.pin(incomplete_control);
                            if (pin_result != AlreadyPinned)
                            {
                                if (pin_result == PinFailed)
                                {
                                    return Allocation{};
                                }
                                auto updated_tail = m_tail.load(mem_relaxed);
                                if (updated_tail != tail)
                                {
                                    tail = updated_tail;
                                    continue;
                                }
                            }

                            // Note: NEEDS ZEROED-PAGES
                            uintptr_t expected_next = 0;
                            raw_atomic_compare_exchange_weak(
                              &incomplete_control->m_next,
                              &expected_next,
                              uintptr_t(next + LfQueue_Busy),
                              mem_relaxed);
                            if (m_tail.compare_exchange_weak(tail, next, mem_relaxed))
                            {
                                tail = next;
                            }
                        }
                    }
                }
                else
                {
                    // legacy heap allocations can only be blocking
                    if (guarantee == LfQueue_LockFree || guarantee == LfQueue_WaitFree)
                        return Allocation{};

                    return Base::template external_allocate<PROGRESS_GUARANTEE>(
                      i_control_bits, i_size, i_alignment);
                }
            }